

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glad.c
# Opt level: O0

void load_GL_SGIS_pixel_texture(GLADloadproc load)

{
  GLADloadproc load_local;
  
  if (GLAD_GL_SGIS_pixel_texture != 0) {
    glad_glPixelTexGenParameteriSGIS =
         (PFNGLPIXELTEXGENPARAMETERISGISPROC)(*load)("glPixelTexGenParameteriSGIS");
    glad_glPixelTexGenParameterivSGIS =
         (PFNGLPIXELTEXGENPARAMETERIVSGISPROC)(*load)("glPixelTexGenParameterivSGIS");
    glad_glPixelTexGenParameterfSGIS =
         (PFNGLPIXELTEXGENPARAMETERFSGISPROC)(*load)("glPixelTexGenParameterfSGIS");
    glad_glPixelTexGenParameterfvSGIS =
         (PFNGLPIXELTEXGENPARAMETERFVSGISPROC)(*load)("glPixelTexGenParameterfvSGIS");
    glad_glGetPixelTexGenParameterivSGIS =
         (PFNGLGETPIXELTEXGENPARAMETERIVSGISPROC)(*load)("glGetPixelTexGenParameterivSGIS");
    glad_glGetPixelTexGenParameterfvSGIS =
         (PFNGLGETPIXELTEXGENPARAMETERFVSGISPROC)(*load)("glGetPixelTexGenParameterfvSGIS");
  }
  return;
}

Assistant:

static void load_GL_SGIS_pixel_texture(GLADloadproc load) {
	if(!GLAD_GL_SGIS_pixel_texture) return;
	glad_glPixelTexGenParameteriSGIS = (PFNGLPIXELTEXGENPARAMETERISGISPROC)load("glPixelTexGenParameteriSGIS");
	glad_glPixelTexGenParameterivSGIS = (PFNGLPIXELTEXGENPARAMETERIVSGISPROC)load("glPixelTexGenParameterivSGIS");
	glad_glPixelTexGenParameterfSGIS = (PFNGLPIXELTEXGENPARAMETERFSGISPROC)load("glPixelTexGenParameterfSGIS");
	glad_glPixelTexGenParameterfvSGIS = (PFNGLPIXELTEXGENPARAMETERFVSGISPROC)load("glPixelTexGenParameterfvSGIS");
	glad_glGetPixelTexGenParameterivSGIS = (PFNGLGETPIXELTEXGENPARAMETERIVSGISPROC)load("glGetPixelTexGenParameterivSGIS");
	glad_glGetPixelTexGenParameterfvSGIS = (PFNGLGETPIXELTEXGENPARAMETERFVSGISPROC)load("glGetPixelTexGenParameterfvSGIS");
}